

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void __thiscall CMU462::Camera::compute_position(Camera *this)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  Vector3D *pVVar5;
  Matrix3x3 *this_00;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Vector3D local_58;
  undefined1 local_38 [16];
  double local_28;
  
  dVar8 = sin(this->phi);
  uVar6 = SUB84(dVar8,0);
  uVar7 = (undefined4)((ulong)dVar8 >> 0x20);
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    dVar8 = this->phi + 9.999999747378752e-06;
    this->phi = dVar8;
    dVar8 = sin(dVar8);
    uVar6 = SUB84(dVar8,0);
    uVar7 = (undefined4)((ulong)dVar8 >> 0x20);
  }
  dVar8 = this->r;
  dVar9 = sin(this->theta);
  dVar1 = this->r;
  dVar10 = cos(this->phi);
  dVar2 = this->r;
  dVar4 = cos(this->theta);
  dVar4 = dVar4 * (double)CONCAT44(uVar7,uVar6) * dVar2;
  dVar2 = (this->targetPos).z;
  dVar9 = dVar9 * dVar8 * (double)CONCAT44(uVar7,uVar6);
  dVar10 = dVar10 * dVar1;
  dVar8 = (this->targetPos).y;
  (this->pos).x = (this->targetPos).x + dVar9;
  (this->pos).y = dVar8 + dVar10;
  (this->pos).z = dVar2 + dVar4;
  local_28 = dVar10 * 0.0 -
             dVar9 * *(double *)
                      (&DAT_001e6850 +
                      (ulong)(0.0 <= (double)CONCAT44(uVar7,uVar6) &&
                             (double)CONCAT44(uVar7,uVar6) != 0.0) * 8);
  dVar8 = dVar9 * 0.0 + dVar4 * -0.0;
  local_38._8_4_ = SUB84(dVar8,0);
  local_38._0_8_ =
       *(double *)
        (&DAT_001e6850 +
        (ulong)(0.0 <= (double)CONCAT44(uVar7,uVar6) && (double)CONCAT44(uVar7,uVar6) != 0.0) * 8) *
       dVar4 + dVar10 * -0.0;
  local_38._12_4_ = (int)((ulong)dVar8 >> 0x20);
  Vector3D::normalize((Vector3D *)local_38);
  local_58.x = local_28 * dVar10 - dVar4 * (double)local_38._8_8_;
  local_58.y = (double)local_38._0_8_ * dVar4 - dVar9 * local_28;
  local_58.z = dVar9 * (double)local_38._8_8_ - (double)local_38._0_8_ * dVar10;
  Vector3D::normalize(&local_58);
  this_00 = &this->c2w;
  pVVar5 = Matrix3x3::operator[](this_00,0);
  pVVar5->x = (double)local_38._0_8_;
  pVVar5->y = (double)local_38._8_8_;
  pVVar5->z = local_28;
  pVVar5 = Matrix3x3::operator[](this_00,1);
  pVVar5->x = local_58.x;
  pVVar5->y = local_58.y;
  pVVar5->z = local_58.z;
  dVar8 = 1.0 / SQRT(dVar4 * dVar4 + dVar9 * dVar9 + dVar10 * dVar10);
  pVVar5 = Matrix3x3::operator[](this_00,2);
  auVar3._8_4_ = SUB84(dVar8 * dVar10,0);
  auVar3._0_8_ = dVar8 * dVar9;
  auVar3._12_4_ = (int)((ulong)(dVar8 * dVar10) >> 0x20);
  pVVar5->x = dVar8 * dVar9;
  pVVar5->y = (double)auVar3._8_8_;
  pVVar5->z = dVar4 * dVar8;
  return;
}

Assistant:

void Camera::compute_position() {
    double sinPhi = sin(phi);
    if (sinPhi == 0) {
      phi += EPS_F;
      sinPhi = sin(phi);
    }
    const Vector3D dirToCamera(r * sinPhi * sin(theta),
        r * cos(phi),
        r * sinPhi * cos(theta));
    pos = targetPos + dirToCamera;
    Vector3D upVec(0, sinPhi > 0 ? 1 : -1, 0);
    Vector3D screenXDir = cross(upVec, dirToCamera);
    screenXDir.normalize();
    Vector3D screenYDir = cross(dirToCamera, screenXDir);
    screenYDir.normalize();

    c2w[0] = screenXDir;
    c2w[1] = screenYDir;
    c2w[2] = dirToCamera.unit();   // camera's view direction is the
    // opposite of of dirToCamera, so
    // directly using dirToCamera as
    // column 2 of the matrix takes [0 0 -1]
    // to the world space view direction
  }